

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O2

Gia_Man_t *
Gia_ManSweepWithBoxes
          (Gia_Man_t *p,void *pParsC,void *pParsS,int fConst,int fEquiv,int fVerbose,int fVerbEquivs
          )

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Gia_Man_t *pGVar6;
  Gia_Man_t *pGVar7;
  int *pReprs;
  Gia_Man_t *p_00;
  ulong uVar8;
  uint uVar9;
  undefined8 local_40;
  undefined4 local_38;
  
  local_38 = 0;
  local_40 = 0;
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x2d1,
                  "Gia_Man_t *Gia_ManSweepWithBoxes(Gia_Man_t *, void *, void *, int, int, int, int)"
                 );
  }
  if (p->pAigExtra != (Gia_Man_t *)0x0) {
    if (pParsC == (void *)0x0) {
      iVar3 = Gia_ManClockDomainNum(p);
      if (1 < iVar3) {
        pGVar6 = Gia_ManSweepWithBoxesAndDomains(p,pParsS,fConst,fEquiv,fVerbose,fVerbEquivs);
        return pGVar6;
      }
    }
    pGVar6 = Gia_ManDupUnnormalize(p);
    if (pGVar6 == (Gia_Man_t *)0x0) {
      pGVar6 = (Gia_Man_t *)0x0;
    }
    else {
      Gia_ManTransferTiming(pGVar6,p);
      uVar4 = Vec_IntCountEntry(pGVar6->vRegClasses,1);
      pGVar7 = Gia_ManDupCollapse(pGVar6,pGVar6->pAigExtra,(Vec_Int_t *)0x0,
                                  (uint)(pParsC == (void *)0x0));
      if (pParsC == (void *)0x0) {
        if (pParsS == (void *)0x0) {
          Gia_ManSeqCleanupClasses(pGVar7,fConst,fEquiv,fVerbose);
        }
        else {
          Cec_ManLSCorrespondenceClasses(pGVar7,(Cec_ParCor_t *)pParsS);
        }
      }
      else {
        Gia_ManFraigSweepPerform(pGVar7,pParsC);
      }
      pReprs = Gia_ManFraigSelectReprs(pGVar6,pGVar7,fVerbose,(int *)&local_40);
      Gia_ManStop(pGVar7);
      Gia_ManTransferTiming(p,pGVar6);
      pGVar7 = Gia_ManFraigReduceGia(pGVar6,pReprs);
      Gia_ManTransferTiming(pGVar7,p);
      Gia_ManStop(pGVar6);
      free(pReprs);
      p_00 = Gia_ManDupWithBoxes(pGVar7,(uint)(pParsC == (void *)0x0));
      Gia_ManStop(pGVar7);
      uVar5 = Vec_IntCountEntry(p_00->vRegClasses,1);
      uVar1 = local_40;
      if (fVerbEquivs != 0) {
        uVar2 = local_40._4_4_;
        uVar9 = uVar4 - ((int)local_40 + local_40._4_4_ + uVar5);
        printf("Domain %2d : %5d -> %5d :  ",1,(ulong)uVar4,(ulong)uVar5);
        uVar8 = 0;
        if (0 < (int)uVar9) {
          uVar8 = (ulong)uVar9;
        }
        uVar4 = -uVar9;
        if (-1 < (int)uVar9) {
          uVar4 = 0;
        }
        printf("EqConst =%4d.  EqFlop =%4d.  Dangling =%4d.  Unused =%4d.\n",uVar1 & 0xffffffff,
               (ulong)uVar2,uVar8,(ulong)uVar4);
      }
      pGVar6 = Gia_ManDupNormalize(p_00,0);
      Gia_ManTransferTiming(pGVar6,p_00);
      Gia_ManStop(p_00);
    }
    return pGVar6;
  }
  __assert_fail("p->pAigExtra != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                ,0x2d2,
                "Gia_Man_t *Gia_ManSweepWithBoxes(Gia_Man_t *, void *, void *, int, int, int, int)")
  ;
}

Assistant:

Gia_Man_t * Gia_ManSweepWithBoxes( Gia_Man_t * p, void * pParsC, void * pParsS, int fConst, int fEquiv, int fVerbose, int fVerbEquivs )
{ 
    Gia_Man_t * pClp, * pNew, * pTemp;
    int * pReprs, pFlopTypes[3] = {0};
    int nFlopsNew, nFlops;
    assert( Gia_ManRegNum(p) == 0 );
    assert( p->pAigExtra != NULL );
    // consider seq synthesis with multiple clock domains
    if ( pParsC == NULL && Gia_ManClockDomainNum(p) > 1 )
        return Gia_ManSweepWithBoxesAndDomains( p, pParsS, fConst, fEquiv, fVerbose, fVerbEquivs );
    // order AIG objects
    pNew = Gia_ManDupUnnormalize( p );
    if ( pNew == NULL )
        return NULL;
    Gia_ManTransferTiming( pNew, p );
    nFlops = Vec_IntCountEntry(pNew->vRegClasses, 1);
    // find global equivalences
    pClp = Gia_ManDupCollapse( pNew, pNew->pAigExtra, NULL, pParsC ? 0 : 1 );
    //Gia_DumpAiger( pClp, p->pSpec, 1, 1 );
    // compute equivalences
    if ( pParsC )
        Gia_ManFraigSweepPerform( pClp, pParsC );
    else if ( pParsS )
        Cec_ManLSCorrespondenceClasses( pClp, (Cec_ParCor_t *)pParsS );
    else 
        Gia_ManSeqCleanupClasses( pClp, fConst, fEquiv, fVerbose );
    // transfer equivalences
    pReprs = Gia_ManFraigSelectReprs( pNew, pClp, fVerbose, pFlopTypes );
    Gia_ManStop( pClp );
    // reduce AIG
    Gia_ManTransferTiming( p, pNew );
    pNew = Gia_ManFraigReduceGia( pTemp = pNew, pReprs );
    Gia_ManTransferTiming( pNew, p );
    Gia_ManStop( pTemp );
    ABC_FREE( pReprs );
    // derive new AIG
    pNew = Gia_ManDupWithBoxes( pTemp = pNew, pParsC ? 0 : 1 );
    Gia_ManStop( pTemp );
    // report
    nFlopsNew = Vec_IntCountEntry(pNew->vRegClasses, 1);
    pFlopTypes[2] = nFlops - nFlopsNew - (pFlopTypes[0] + pFlopTypes[1]);
    if ( fVerbEquivs )
    {
        printf( "Domain %2d : %5d -> %5d :  ", 1, nFlops, nFlopsNew );
        printf( "EqConst =%4d.  EqFlop =%4d.  Dangling =%4d.  Unused =%4d.\n", 
            pFlopTypes[0], pFlopTypes[1], Abc_MaxInt(0, pFlopTypes[2]), Abc_MaxInt(0, -pFlopTypes[2]) );
    }
    // normalize the result
    pNew = Gia_ManDupNormalize( pTemp = pNew, 0 );
    Gia_ManTransferTiming( pNew, pTemp );
    Gia_ManStop( pTemp );
    // check integrity
    //Gia_ManCheckIntegrityWithBoxes( pNew );
    return pNew;
}